

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O1

void emit_ii_op(function *fn,int A,int B,int C,int pc,char *op)

{
  TValue *pTVar1;
  GCObject *pGVar2;
  GCObject *pGVar3;
  GCObject *pGVar4;
  char *fmt;
  undefined4 in_register_00000084;
  
  pGVar2 = (GCObject *)CONCAT44(in_register_00000084,pc);
  emit_reg(fn,"ra",A);
  if ((char)B < '\0') {
    pTVar1 = fn->p->k;
    emit_reg_or_k(fn,"rc",C);
    pGVar4 = pTVar1[B & 0xffffff7f].value_.gc;
    fmt = "setivalue(ra, %lld %s ivalue(rc));\n";
    pGVar3 = pGVar2;
  }
  else {
    if (-1 < (char)C) {
      emit_reg_or_k(fn,"rb",B);
      emit_reg_or_k(fn,"rc",C);
      membuff_add_fstring(&fn->body,"setivalue(ra, ivalue(rb) %s ivalue(rc));\n",pGVar2);
      return;
    }
    pTVar1 = fn->p->k;
    emit_reg_or_k(fn,"rb",B);
    fmt = "setivalue(ra, ivalue(rb) %s %lld);\n";
    pGVar3 = pTVar1[C & 0xffffff7f].value_.gc;
    pGVar4 = pGVar2;
  }
  membuff_add_fstring(&fn->body,fmt,pGVar4,pGVar3);
  return;
}

Assistant:

static void emit_ii_op(struct function *fn, int A, int B, int C, int pc, const char *op) {
  (void)pc;
  emit_reg(fn, "ra", A);
  if (ISK(B)) {
    TValue *Konst1 = &fn->p->k[INDEXK(B)];
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setivalue(ra, %lld %s ivalue(rc));\n", Konst1->value_.i, op);
  }
  else if (ISK(C)) {
    TValue *Konst1 = &fn->p->k[INDEXK(C)];
    emit_reg_or_k(fn, "rb", B);
    membuff_add_fstring(&fn->body, "setivalue(ra, ivalue(rb) %s %lld);\n", op, Konst1->value_.i);
  }
  else {
    emit_reg_or_k(fn, "rb", B);
    emit_reg_or_k(fn, "rc", C);
    membuff_add_fstring(&fn->body, "setivalue(ra, ivalue(rb) %s ivalue(rc));\n", op);
  }
}